

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void dump_symbol_table(SymbolTable *s)

{
  Bucket *pBVar1;
  uint local_24;
  int local_20;
  int collisions;
  int j;
  int i;
  Bucket *b;
  SymbolTable *s_local;
  
  local_24 = 0;
  for (collisions = 0; collisions < 0xfd; collisions = collisions + 1) {
    pBVar1 = s->bucket[collisions];
    if (0 < pBVar1->num_symbols) {
      printf("Bucket #%d:\n---------------\n",(ulong)(uint)collisions);
      for (local_20 = 0; local_20 < pBVar1->num_symbols; local_20 = local_20 + 1) {
        printf("\t\"%s\"\t:\t%ld\n",pBVar1->symbol[local_20].name,pBVar1->symbol[local_20].value.n);
      }
      local_24 = pBVar1->num_symbols + -1 + local_24;
    }
  }
  printf("Total collisions: %d\n",(ulong)local_24);
  return;
}

Assistant:

void
dump_symbol_table (const SymbolTable *s)
{
  const Bucket *b;
  int i, j, collisions;

  for (i = collisions = 0; i < HASH_BUCKETS; i++)
    {
      b = s->bucket[i];
      if (b->num_symbols > 0)
	{
	  printf ("Bucket #%d:\n---------------\n", i);
	  for (j = 0; j < b->num_symbols; j++)
	    printf ("\t\"%s\"\t:\t%ld\n", b->symbol[j].name,
		    b->symbol[j].value.n);
	  collisions += b->num_symbols - 1;
	}
    }

  printf ("Total collisions: %d\n", collisions);
}